

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O3

region_ptr __thiscall
cornelich::vanilla_index::index_for
          (vanilla_index *this,int32_t cycle,int32_t file_number,bool append)

{
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *phVar1;
  type *ptVar2;
  long lVar3;
  string *base_path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Head_base<1UL,_int,_false> _Var5;
  hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
  *this_00;
  iterator iVar6;
  undefined7 in_register_00000009;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_00;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_01;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_03;
  hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
  *extraout_RDX_04;
  undefined4 in_register_00000034;
  undefined8 *puVar8;
  final_node_type *x;
  bool in_R8B;
  spin_lock *psVar9;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_bool>
  pVar10;
  region_ptr rVar11;
  __tuple_element_t<1UL,_tuple<int,_int>_> file_number_;
  region *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_240;
  spin_lock *local_238;
  _Head_base<1UL,_int,_false> local_230;
  _Head_base<0UL,_int,_false> _Stack_22c;
  _Head_base<1UL,_int,_false> local_224;
  hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
  *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  ios_base local_138 [264];
  
  puVar8 = (undefined8 *)CONCAT44(in_register_00000034,cycle);
  local_238 = (spin_lock *)((long)puVar8 + 0xc);
  util::spin_lock::lock<cornelich::util::default_backoff<5ul>>(local_238,(default_backoff<5UL>)0x1);
  local_230._M_head_impl = (int)CONCAT71(in_register_00000009,append);
  _Stack_22c._M_head_impl = file_number;
  iVar6 = boost::multi_index::detail::
          hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
          ::
          find<std::tuple<int,int>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>>
                    ((hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)(puVar8 + 6),&local_230,(long)puVar8 + 0x31,(long)puVar8 + 0x32);
  _Var5._M_head_impl = local_230._M_head_impl;
  phVar1 = (hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
            *)puVar8[5];
  if (iVar6.node == phVar1) {
    local_224._M_head_impl = local_230._M_head_impl;
    base_path = (string *)*puVar8;
    cycle_formatter::date_from_cycle_abi_cxx11_
              (&local_218,(cycle_formatter *)base_path[1]._M_string_length,
               (long)_Stack_22c._M_head_impl);
    local_220 = (hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                 *)(puVar8 + 6);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,INDEX_FILE_NAME_PREFIX_abi_cxx11_,DAT_00177760);
    std::ostream::operator<<((ostream *)&local_1a8,_Var5._M_head_impl);
    std::__cxx11::stringbuf::str();
    make_file(&local_1f8,base_path,&local_218,&local_1d8,in_R8B);
    this_00 = local_220;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    if (local_1f8._M_string_length == 0) {
      local_248 = (region *)0x0;
      _Stack_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_1b8._0_8_ = 1L << (*(byte *)(puVar8 + 1) & 0x3f);
      local_248 = (region *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cornelich::region,std::allocator<cornelich::region>,std::__cxx11::string&,long_long,int&>
                (&_Stack_240,&local_248,(allocator<cornelich::region> *)&local_218,&local_1f8,
                 (longlong *)local_1b8,&local_224._M_head_impl);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    }
    _Var4._M_pi = _Stack_240._M_pi;
    if (local_248 == (region *)0x0) {
      this->m_settings = (vanilla_chronicle_settings *)0x0;
      _Stack_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->m_index_block_size_bits = _Var4._M_pi
      ;
      psVar9 = local_238;
    }
    else {
      if ((ulong)puVar8[2] <= (ulong)puVar8[0xd]) {
        x = (final_node_type *)(*(long *)(puVar8[5] + 0x30) + -0x28);
        if (*(long *)(puVar8[5] + 0x30) == 0) {
          x = (final_node_type *)0x0;
        }
        boost::multi_index::
        multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
        ::erase_((multi_index_container<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                  *)(puVar8 + 4),x);
      }
      local_1b8._4_4_ = _Stack_22c._M_head_impl;
      local_1b8._0_4_ =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)local_230._M_head_impl;
      local_1b8._8_8_ = local_248;
      local_1a8._M_pi = _Stack_240._M_pi;
      if (_Stack_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_240._M_pi)->_M_use_count = (_Stack_240._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_240._M_pi)->_M_use_count = (_Stack_240._M_pi)->_M_use_count + 1;
        }
      }
      pVar10 = boost::multi_index::detail::
               sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
               ::insert((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                         *)this_00,
                        (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
                         *)puVar8[5],(value_type *)local_1b8);
      psVar9 = local_238;
      _Var7._M_pi = pVar10._8_8_;
      if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      }
      this->m_settings =
           *(vanilla_chronicle_settings **)
            ((long)&((pVar10.first.node.node)->
                    super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                    ).
                    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                    .
                    super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                    .space.data_ + 8);
      lVar3 = *(long *)((long)&((pVar10.first.node.node)->
                               super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                               ).
                               super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                               .
                               super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                               .space.data_ + 0x10);
      this->m_index_block_size_bits = (int)lVar3;
      this->m_lock = (mutex_t)(char)((ulong)lVar3 >> 0x20);
      *(int3 *)&this->field_0xd = (int3)((ulong)lVar3 >> 0x28);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
    }
    if (_Stack_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_240._M_pi);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04;
    }
  }
  else {
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(phVar1 + 1);
    ptVar2 = *(type **)((long)&iVar6.node[1].
                               super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                               .
                               super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                               .space.data_ + 8);
    *(type **)((long)iVar6.node[1].
                     super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                     .
                     super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                     .space.data_.align_ + 8) = ptVar2;
    *ptVar2 = iVar6.node[1].
              super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
              .
              super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
              .space.data_.align_;
    iVar6.node[1].
    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
    .super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>.
    space.data_.align_ =
         phVar1[1].
         super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
         .
         super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
         .space.data_.align_;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&iVar6.node[1].
             super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
             .
             super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
             .space.data_ + 8) = _Var7._M_pi;
    phVar1[1].
    super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
    .super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>.
    space.data_.align_ = (type)(iVar6.node + 1);
    *(hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
      **)((long)iVar6.node[1].
                super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                .
                super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                .space.data_.align_ + 8) = iVar6.node + 1;
    this->m_settings =
         *(vanilla_chronicle_settings **)
          ((long)&((iVar6.node)->
                  super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                  ).
                  super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                  .space.data_ + 8);
    lVar3 = *(long *)((long)&((iVar6.node)->
                             super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                             ).
                             super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                             .space.data_ + 0x10);
    this->m_index_block_size_bits = (int)lVar3;
    this->m_lock = (mutex_t)(char)((ulong)lVar3 >> 0x20);
    *(int3 *)&this->field_0xd = (int3)((ulong)lVar3 >> 0x28);
    psVar9 = local_238;
    if (lVar3 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
  }
  (psVar9->m_flag).super___atomic_flag_base._M_i = false;
  rVar11.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  rVar11.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (region_ptr)rVar11.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

region_ptr vanilla_index::index_for(std::int32_t cycle, std::int32_t file_number, bool append)
{
    std::lock_guard<mutex_t> lk(m_lock);
    auto key = std::make_pair(cycle, file_number);
    auto && creator = [this, append](const key_t & k)
    {
        auto cycle_ = std::get<0>(k);
        auto file_number_ = std::get<1>(k);
        auto && path = make_file(m_settings.path(),
                                 m_settings.cycle_format().date_from_cycle(cycle_),
                                 (util::streamer() << INDEX_FILE_NAME_PREFIX << file_number_).str(),
                                 append);
        return !path.empty()
                ? std::make_shared<region>(path, 1LL << m_index_block_size_bits, file_number_)
                : region_ptr();
    };

    return m_cache.get(key, creator);
}